

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::App::get_option_no_throw(App *this,string *option_name)

{
  bool bVar1;
  pointer pOVar2;
  element_type *peVar3;
  ulong uVar4;
  Option *pOVar5;
  string local_a8;
  undefined8 local_88;
  Option *opt_1;
  shared_ptr<CLI::App> *subc;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_1;
  reference local_40;
  Option_p *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  string *option_name_local;
  App *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                     *)&opt), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
               ::operator*(&__end2);
    pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_40);
    ::std::__cxx11::string::string((string *)&__range2_1,(string *)option_name);
    bVar1 = Option::check_name(pOVar2,(string *)&__range2_1);
    ::std::__cxx11::string::~string((string *)&__range2_1);
    if (bVar1) {
      pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_40);
      return pOVar2;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
  subc = (shared_ptr<CLI::App> *)
         std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                   (&this->subcommands_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        *)&subc);
    if (!bVar1) {
      return (Option *)0x0;
    }
    opt_1 = (Option *)
            __gnu_cxx::
            __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
            ::operator*(&__end2_1);
    peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        opt_1);
    get_name_abi_cxx11_(peVar3);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )opt_1);
      ::std::__cxx11::string::string((string *)&local_a8,(string *)option_name);
      pOVar5 = get_option_no_throw(peVar3,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      if (pOVar5 != (Option *)0x0) {
        return pOVar5;
      }
      local_88 = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

const Option *get_option_no_throw(std::string option_name) const noexcept {
        for(const Option_p &opt : options_) {
            if(opt->check_name(option_name)) {
                return opt.get();
            }
        }
        for(const auto &subc : subcommands_) {
            // also check down into nameless subcommands
            if(subc->get_name().empty()) {
                auto opt = subc->get_option_no_throw(option_name);
                if(opt != nullptr) {
                    return opt;
                }
            }
        }
        return nullptr;
    }